

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

String * __thiscall
LiteScript::Character::operator=(String *__return_storage_ptr__,Character *this,String *str)

{
  String::Replace(this->str,this->i,str);
  std::__cxx11::u32string::u32string((u32string *)__return_storage_ptr__,&str->str);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::String LiteScript::Character::operator=(const LiteScript::String& str) {
    this->str.Replace(this->i, str);
    return str;
}